

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CEditorImage::LoadAutoMapper(CEditorImage *this)

{
  int iVar1;
  IStorage *pIVar2;
  undefined4 extraout_var;
  CDoodadsMapper *this_00;
  IConsole *pIVar3;
  _json_value *p_Var4;
  void *pvVar5;
  CConfig *pCVar6;
  char *pcVar7;
  long lVar8;
  long in_RDI;
  long in_FS_OFFSET;
  json_value *rDoodads;
  json_value *rTileset;
  json_value *pJsonData;
  char *pFileData;
  int FileSize;
  IOHANDLE File;
  json_settings JsonSettings;
  char aError [256];
  char aBuf [512];
  json_value *value;
  IOHANDLE io;
  _json_value *in_stack_fffffffffffffc38;
  CEditor *in_stack_fffffffffffffc48;
  char *buffer;
  CTilesetMapper *in_stack_fffffffffffffc50;
  CEditor *in_stack_fffffffffffffc68;
  char *in_stack_fffffffffffffcd0;
  size_t in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  json_settings *in_stack_fffffffffffffce8;
  undefined1 local_308 [256];
  char local_208 [512];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x1a8) == 0) {
    str_format(local_208,0x200,"editor/automap/%s.json",in_RDI + 0x28);
    pIVar2 = CEditor::Storage(*(CEditor **)(in_RDI + 0x18));
    value = (json_value *)0x0;
    io = (IOHANDLE)0x0;
    iVar1 = (*(pIVar2->super_IInterface)._vptr_IInterface[4])(pIVar2,local_208,1,0xffffffff,0,0);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      io_length(io);
      mem_alloc(0);
      io_read(io,value,0);
      io_close((IOHANDLE)0x1ea74d);
      mem_zero(io,(uint)((ulong)value >> 0x20));
      this_00 = (CDoodadsMapper *)
                json_parse_ex(in_stack_fffffffffffffce8,
                              (char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                              in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
      mem_free((void *)0x1ea796);
      if (this_00 == (CDoodadsMapper *)0x0) {
        pIVar3 = CEditor::Console(*(CEditor **)(in_RDI + 0x18));
        (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])(pIVar3,1,local_208,local_308,0);
      }
      else {
        IAutoMapper::GetTypeName(0);
        p_Var4 = _json_value::operator[](in_stack_fffffffffffffc38,(char *)io);
        if (p_Var4->type == json_array) {
          pvVar5 = operator_new(0x28);
          CTilesetMapper::CTilesetMapper(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          *(void **)(in_RDI + 0x1a8) = pvVar5;
          (**(code **)(**(long **)(in_RDI + 0x1a8) + 0x10))(*(long **)(in_RDI + 0x1a8),p_Var4);
        }
        else {
          IAutoMapper::GetTypeName(1);
          p_Var4 = _json_value::operator[](in_stack_fffffffffffffc38,(char *)io);
          if (p_Var4->type == json_array) {
            pvVar5 = operator_new(0x68);
            CDoodadsMapper::CDoodadsMapper(this_00,in_stack_fffffffffffffc68);
            *(void **)(in_RDI + 0x1a8) = pvVar5;
            (**(code **)(**(long **)(in_RDI + 0x1a8) + 0x10))(*(long **)(in_RDI + 0x1a8),p_Var4);
          }
        }
        json_value_free(value);
        if ((*(long *)(in_RDI + 0x1a8) != 0) &&
           (pCVar6 = CEditor::Config(*(CEditor **)(in_RDI + 0x18)), pCVar6->m_Debug != 0)) {
          buffer = local_208;
          lVar8 = in_RDI + 0x28;
          iVar1 = IAutoMapper::GetType(*(IAutoMapper **)(in_RDI + 0x1a8));
          pcVar7 = IAutoMapper::GetTypeName(iVar1);
          str_format(buffer,0x200,"loaded %s.json (%s)",lVar8,pcVar7);
          pIVar3 = CEditor::Console(*(CEditor **)(in_RDI + 0x18));
          (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])(pIVar3,2,"editor",local_208,0);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditorImage::LoadAutoMapper()
{
	if(m_pAutoMapper)
		return;

	// read file data into buffer
	char aBuf[IO_MAX_PATH_LENGTH];
	str_format(aBuf, sizeof(aBuf), "editor/automap/%s.json", m_aName);
	IOHANDLE File = m_pEditor->Storage()->OpenFile(aBuf, IOFLAG_READ, IStorage::TYPE_ALL);
	if(!File)
		return;
	int FileSize = (int)io_length(File);
	char *pFileData = (char *)mem_alloc(FileSize);
	io_read(File, pFileData, FileSize);
	io_close(File);

	// parse json data
	json_settings JsonSettings;
	mem_zero(&JsonSettings, sizeof(JsonSettings));
	char aError[256];
	json_value *pJsonData = json_parse_ex(&JsonSettings, pFileData, FileSize, aError);
	mem_free(pFileData);

	if(pJsonData == 0)
	{
		m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_ADDINFO, aBuf, aError);
		return;
	}

	// generate configurations
	const json_value &rTileset = (*pJsonData)[(const char *)IAutoMapper::GetTypeName(IAutoMapper::TYPE_TILESET)];
	if(rTileset.type == json_array)
	{
		m_pAutoMapper = new CTilesetMapper(m_pEditor);
		m_pAutoMapper->Load(rTileset);
	}
	else
	{
		const json_value &rDoodads = (*pJsonData)[(const char *)IAutoMapper::GetTypeName(IAutoMapper::TYPE_DOODADS)];
		if(rDoodads.type == json_array)
		{
			m_pAutoMapper = new CDoodadsMapper(m_pEditor);
			m_pAutoMapper->Load(rDoodads);
		}
	}

	// clean up
	json_value_free(pJsonData);
	if(m_pAutoMapper && m_pEditor->Config()->m_Debug)
	{
		str_format(aBuf, sizeof(aBuf),"loaded %s.json (%s)", m_aName, IAutoMapper::GetTypeName(m_pAutoMapper->GetType()));
		m_pEditor->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "editor", aBuf);
	}
}